

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smb.c
# Opt level: O0

CURLcode smb_send_setup(connectdata *conn)

{
  size_t sVar1;
  size_t sVar2;
  char *pcVar3;
  size_t byte_count;
  uchar nt [24];
  uchar local_4a8 [8];
  uchar nt_hash [21];
  uchar local_488 [8];
  uchar lm [24];
  uchar local_468 [8];
  uchar lm_hash [21];
  char *p;
  undefined2 local_438;
  undefined1 uStack_436;
  smb_setup msg;
  smb_conn *smbc;
  connectdata *conn_local;
  
  msg.bytes._1016_8_ = &conn->proto;
  sVar1 = strlen((char *)(conn->proto).ftpc.pp.cache_size);
  sVar2 = strlen(*(char **)(msg.bytes._1016_8_ + 0x10));
  if (sVar1 + sVar2 + 0x3d < 0x401) {
    Curl_ntlm_core_mk_lm_hash(conn->data,conn->passwd,local_468);
    Curl_ntlm_core_lm_resp(local_468,(uchar *)(msg.bytes._1016_8_ + 0x18),local_488);
    Curl_ntlm_core_mk_nt_hash(conn->data,conn->passwd,local_4a8);
    Curl_ntlm_core_lm_resp(local_4a8,(uchar *)(msg.bytes._1016_8_ + 0x18),(uchar *)&byte_count);
    memset((void *)((long)&p + 3),0,0x41d);
    p._3_1_ = 0xd;
    p._4_1_ = 0xff;
    local_438 = 0x9000;
    _uStack_436 = 1;
    msg.andx.command = '\x01';
    msg.andx.pad = '\0';
    msg._3_4_ = *(undefined4 *)(msg.bytes._1016_8_ + 0x20);
    msg.lengths[0] = 8;
    msg.lengths[1] = 0;
    msg.max_mpx_count = 0x18;
    msg.vc_number = 0x18;
    msg._21_8_ = local_488;
    msg.bytes[0] = lm[0];
    msg.bytes[1] = lm[1];
    msg.bytes[2] = lm[2];
    msg.bytes[3] = lm[3];
    msg.bytes[4] = lm[4];
    msg.bytes[5] = lm[5];
    msg.bytes[6] = lm[6];
    msg.bytes[7] = lm[7];
    msg.bytes[8] = lm[8];
    msg.bytes[9] = lm[9];
    msg.bytes[10] = lm[10];
    msg.bytes[0xb] = lm[0xb];
    msg.bytes[0xc] = lm[0xc];
    msg.bytes[0xd] = lm[0xd];
    msg.bytes[0xe] = lm[0xe];
    msg.bytes[0xf] = lm[0xf];
    msg.bytes[0x10] = (undefined1)byte_count;
    msg.bytes[0x11] = byte_count._1_1_;
    msg.bytes[0x12] = byte_count._2_1_;
    msg.bytes[0x13] = byte_count._3_1_;
    msg.bytes[0x14] = byte_count._4_1_;
    msg.bytes[0x15] = byte_count._5_1_;
    msg.bytes[0x16] = byte_count._6_1_;
    msg.bytes[0x17] = byte_count._7_1_;
    msg.bytes[0x18] = nt[0];
    msg.bytes[0x19] = nt[1];
    msg.bytes[0x1a] = nt[2];
    msg.bytes[0x1b] = nt[3];
    msg.bytes[0x1c] = nt[4];
    msg.bytes[0x1d] = nt[5];
    msg.bytes[0x1e] = nt[6];
    msg.bytes[0x1f] = nt[7];
    msg.bytes[0x20] = nt[8];
    msg.bytes[0x21] = nt[9];
    msg.bytes[0x22] = nt[10];
    msg.bytes[0x23] = nt[0xb];
    msg.bytes[0x24] = nt[0xc];
    msg.bytes[0x25] = nt[0xd];
    msg.bytes[0x26] = nt[0xe];
    msg.bytes[0x27] = nt[0xf];
    pcVar3 = msg.bytes + 0x28;
    strcpy(pcVar3,*(char **)(msg.bytes._1016_8_ + 8));
    sVar1 = strlen(*(char **)(msg.bytes._1016_8_ + 8));
    strcpy(pcVar3 + sVar1 + 1,*(char **)(msg.bytes._1016_8_ + 0x10));
    sVar2 = strlen(*(char **)(msg.bytes._1016_8_ + 0x10));
    pcVar3 = pcVar3 + sVar1 + 1 + sVar2 + 1;
    strcpy(pcVar3,"Linux");
    strcpy(pcVar3 + 6,"curl");
    msg.pad._0_2_ = SUB82(pcVar3 + (0xb - (long)((long)&msg.pad + 2)),0);
    conn_local._4_4_ =
         smb_send_message(conn,'s',(void *)((long)&p + 3),
                          (size_t)(pcVar3 + (0xb - (long)((long)&msg.pad + 2)) + 0x1d));
  }
  else {
    conn_local._4_4_ = CURLE_FILESIZE_EXCEEDED;
  }
  return conn_local._4_4_;
}

Assistant:

static CURLcode smb_send_setup(struct connectdata *conn)
{
  struct smb_conn *smbc = &conn->proto.smbc;
  struct smb_setup msg;
  char *p = msg.bytes;
  unsigned char lm_hash[21];
  unsigned char lm[24];
  unsigned char nt_hash[21];
  unsigned char nt[24];

  size_t byte_count = sizeof(lm) + sizeof(nt);
  byte_count += strlen(smbc->user) + strlen(smbc->domain);
  byte_count += strlen(OS) + strlen(CLIENTNAME) + 4; /* 4 null chars */
  if(byte_count > sizeof(msg.bytes))
    return CURLE_FILESIZE_EXCEEDED;

  Curl_ntlm_core_mk_lm_hash(conn->data, conn->passwd, lm_hash);
  Curl_ntlm_core_lm_resp(lm_hash, smbc->challenge, lm);
#ifdef USE_NTRESPONSES
  Curl_ntlm_core_mk_nt_hash(conn->data, conn->passwd, nt_hash);
  Curl_ntlm_core_lm_resp(nt_hash, smbc->challenge, nt);
#else
  memset(nt, 0, sizeof(nt));
#endif

  memset(&msg, 0, sizeof(msg));
  msg.word_count = SMB_WC_SETUP_ANDX;
  msg.andx.command = SMB_COM_NO_ANDX_COMMAND;
  msg.max_buffer_size = smb_swap16(MAX_MESSAGE_SIZE);
  msg.max_mpx_count = smb_swap16(1);
  msg.vc_number = smb_swap16(1);
  msg.session_key = smb_swap32(smbc->session_key);
  msg.capabilities = smb_swap32(SMB_CAP_LARGE_FILES);
  msg.lengths[0] = smb_swap16(sizeof(lm));
  msg.lengths[1] = smb_swap16(sizeof(nt));
  memcpy(p, lm, sizeof(lm));
  p += sizeof(lm);
  memcpy(p, nt, sizeof(nt));
  p += sizeof(nt);
  MSGCATNULL(smbc->user);
  MSGCATNULL(smbc->domain);
  MSGCATNULL(OS);
  MSGCATNULL(CLIENTNAME);
  byte_count = p - msg.bytes;
  msg.byte_count = smb_swap16((unsigned short)byte_count);

  return smb_send_message(conn, SMB_COM_SETUP_ANDX, &msg,
                          sizeof(msg) - sizeof(msg.bytes) + byte_count);
}